

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.h
# Opt level: O2

Unique<Type>_conflict5 __thiscall anurbs::Box<3L>::load(Box<3L> *this,Model *model,Json *source)

{
  DataReader reader;
  Vector max;
  Vector min;
  allocator<char> local_a1;
  DataReader local_a0;
  string local_98;
  Matrix<double,_1,_3,_1,_1,_3> local_78;
  Matrix<double,_1,_3,_1,_1,_3> local_60;
  Matrix<double,_1,_3,_1,_1,_3> local_48;
  Matrix<double,_1,_3,_1,_1,_3> local_28;
  
  local_a0.m_data = source;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"min",&local_a1);
  local_28.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
       local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  local_28.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] =
       local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [0];
  local_28.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1] =
       local_60.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [1];
  DataReader::fill_vector<Eigen::Matrix<double,1,3,1,1,3>>(&local_a0,&local_98,&local_28);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"max",&local_a1);
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
       local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] =
       local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [0];
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1] =
       local_78.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [1];
  DataReader::fill_vector<Eigen::Matrix<double,1,3,1,1,3>>(&local_a0,&local_98,&local_48);
  std::__cxx11::string::~string((string *)&local_98);
  new_<anurbs::Box<3l>,Eigen::Matrix<double,1,3,1,1,3>&,Eigen::Matrix<double,1,3,1,1,3>&>
            ((anurbs *)this,&local_60,&local_78);
  return (__uniq_ptr_data<anurbs::Box<3L>,_std::default_delete<anurbs::Box<3L>_>,_true,_true>)
         (__uniq_ptr_data<anurbs::Box<3L>,_std::default_delete<anurbs::Box<3L>_>,_true,_true>)this;
}

Assistant:

static Unique<Type> load(Model& model, const Json& source)
    {
        const DataReader reader(source);

        Vector min, max;

        reader.fill_vector("min", min);
        reader.fill_vector("max", max);

        return new_<Type>(min, max);
    }